

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::start_upnp
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *s)

{
  session_settings *__args_1;
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  bool local_99;
  shared_ptr<libtorrent::aux::listen_socket_t> local_80;
  listen_socket_handle local_70;
  undefined1 local_5c [40];
  undefined1 local_34 [24];
  bitfield_flag local_1c;
  undefined1 local_1b;
  uchar local_1a;
  bitfield_flag local_19;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_18;
  shared_ptr<libtorrent::aux::listen_socket_t> *s_local;
  session_impl *this_local;
  
  local_18 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)s;
  s_local = (shared_ptr<libtorrent::aux::listen_socket_t> *)this;
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
  bVar1 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(&peVar2->local_endpoint);
  if (!bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    local_1a = (peVar2->flags).m_val;
    local_1b = 2;
    local_19 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                           )local_1a,
                          (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                           )0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_19);
    local_99 = true;
    if (!bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      local_34[0x17] = (peVar2->flags).m_val;
      local_34[0x16] = '\b';
      local_1c = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                             )local_34[0x17],
                            (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                             )0x8);
      local_99 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1c);
    }
    if (local_99 == false) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->upnp_mapper);
      if (!bVar1) {
        __args_1 = (session_settings *)this->m_io_context;
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_18);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  ((address *)(local_5c + 4),&peVar2->local_endpoint);
        boost::asio::ip::address::to_v4((address *)local_34);
        ::std::
        __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(local_18);
        boost::asio::ip::address::to_v4((address *)local_5c);
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_18);
        ::std::shared_ptr<libtorrent::aux::listen_socket_t>::shared_ptr
                  (&local_80,(shared_ptr<libtorrent::aux::listen_socket_t> *)local_18);
        listen_socket_handle::listen_socket_handle(&local_70,&local_80);
        ::std::
        make_shared<libtorrent::upnp,boost::asio::io_context&,libtorrent::aux::session_settings&,libtorrent::aux::session_impl&,boost::asio::ip::address_v4,boost::asio::ip::address_v4,std::__cxx11::string&,libtorrent::aux::listen_socket_handle>
                  ((io_context *)(local_34 + 4),__args_1,(session_impl *)&this->m_settings,
                   (address_v4 *)this,(address_v4 *)local_34,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c,
                   (listen_socket_handle *)&peVar2->device);
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_18);
        ::std::shared_ptr<libtorrent::upnp>::operator=
                  (&peVar2->upnp_mapper,(shared_ptr<libtorrent::upnp> *)(local_34 + 4));
        ::std::shared_ptr<libtorrent::upnp>::~shared_ptr
                  ((shared_ptr<libtorrent::upnp> *)(local_34 + 4));
        listen_socket_handle::~listen_socket_handle(&local_70);
        ::std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr(&local_80);
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_18);
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar2->upnp_mapper);
        upnp::start(this_00);
      }
    }
  }
  return;
}

Assistant:

void session_impl::start_upnp(std::shared_ptr<aux::listen_socket_t> const& s)
	{
		// until we support SSDP over an IPv6 network (
		// https://en.wikipedia.org/wiki/Simple_Service_Discovery_Protocol )
		// there's no point in starting upnp on one.
		if (is_v6(s->local_endpoint))
			return;

		// there's no point in starting the UPnP mapper for a network that isn't
		// connected to the internet. The whole point is to forward ports through
		// the gateway
		if ((s->flags & listen_socket_t::local_network)
			|| (s->flags & listen_socket_t::proxy))
			return;

		if (!s->upnp_mapper)
		{
			// the upnp constructor may fail and call the callbacks
			// into the session_impl.
			s->upnp_mapper = std::make_shared<upnp>(m_io_context, m_settings
				, *this, s->local_endpoint.address().to_v4(), s->netmask.to_v4(), s->device
				, listen_socket_handle(s));
			s->upnp_mapper->start();
		}
	}